

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall spirv_cross::Compiler::analyze_image_and_sampler_usage(Compiler *this)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  size_t sVar1;
  CombinedImageSampler *pCVar2;
  SPIRFunction *pSVar3;
  const_iterator cVar4;
  __hashtable *__h;
  long lVar5;
  CombinedImageSamplerUsageHandler handler;
  CombinedImageSamplerDrefHandler dref_handler;
  undefined4 local_114;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_110;
  OpcodeHandler local_108;
  Compiler *local_100;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_f8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b8;
  undefined2 local_80;
  OpcodeHandler local_78;
  Compiler *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_78._vptr_OpcodeHandler = (_func_int **)&PTR__CombinedImageSamplerDrefHandler_003fa658;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = this;
  pSVar3 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar3,&local_78);
  local_108._vptr_OpcodeHandler = (_func_int **)&PTR__CombinedImageSamplerUsageHandler_003fa6c8;
  local_f0._M_buckets = &local_f0._M_single_bucket;
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_80 = 0;
  local_100 = this;
  local_f8 = &local_68;
  pSVar3 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar3,&local_108);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_f0);
  pSVar3 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar3,&local_108);
  this_00 = &this->comparison_ids;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign(&this_00->_M_h,&local_b8);
  this->need_subpass_input = local_80._0_1_;
  this->need_subpass_input_ms = local_80._1_1_;
  sVar1 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  if (sVar1 != 0) {
    pCVar2 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.ptr
    ;
    lVar5 = 0;
    do {
      local_110 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)CONCAT44(local_110._4_4_,
                              *(undefined4 *)((long)&(pCVar2->sampler_id).id + lVar5));
      cVar4 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,(key_type *)&local_110);
      if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        local_114 = *(undefined4 *)((long)&(pCVar2->combined_id).id + lVar5);
        local_110 = &this_00->_M_h;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00,&local_114,&local_110);
      }
      lVar5 = lVar5 + 0xc;
    } while (sVar1 * 0xc != lVar5);
  }
  local_108._vptr_OpcodeHandler = (_func_int **)&PTR__CombinedImageSamplerUsageHandler_003fa6c8;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_f0);
  local_78._vptr_OpcodeHandler = (_func_int **)&PTR__CombinedImageSamplerDrefHandler_003fa658;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void Compiler::analyze_image_and_sampler_usage()
{
	CombinedImageSamplerDrefHandler dref_handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), dref_handler);

	CombinedImageSamplerUsageHandler handler(*this, dref_handler.dref_combined_samplers);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	// Need to run this traversal twice. First time, we propagate any comparison sampler usage from leaf functions
	// down to main().
	// In the second pass, we can propagate up forced depth state coming from main() up into leaf functions.
	handler.dependency_hierarchy.clear();
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	comparison_ids = std::move(handler.comparison_ids);
	need_subpass_input = handler.need_subpass_input;
	need_subpass_input_ms = handler.need_subpass_input_ms;

	// Forward information from separate images and samplers into combined image samplers.
	for (auto &combined : combined_image_samplers)
		if (comparison_ids.count(combined.sampler_id))
			comparison_ids.insert(combined.combined_id);
}